

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

FeatureSet *
google::protobuf::descriptor_unittest::GetCoreFeatures<google::protobuf::ServiceDescriptor>
          (FeatureSet *__return_storage_ptr__,ServiceDescriptor *descriptor)

{
  FeatureSet::FeatureSet(__return_storage_ptr__,descriptor->merged_features_);
  FeatureSet::
  ClearExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false>
            (__return_storage_ptr__,
             (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
              *)&pb::test);
  FeatureSet::
  ClearExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false>
            (__return_storage_ptr__,
             (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
              *)&pb::TestMessage::test_message);
  FeatureSet::
  ClearExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false>
            (__return_storage_ptr__,
             (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
              *)&pb::TestMessage_Nested::test_nested);
  return __return_storage_ptr__;
}

Assistant:

FeatureSet GetCoreFeatures(const T* descriptor) {
  FeatureSet features = GetFeatures(descriptor);
  // Strip test features to avoid excessive brittleness.
  features.ClearExtension(pb::test);
  features.ClearExtension(pb::TestMessage::test_message);
  features.ClearExtension(pb::TestMessage::Nested::test_nested);
  return features;
}